

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_preorder.c
# Opt level: O1

void sp_preorder(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *etree,SuperMatrix *AC)

{
  long lVar1;
  int n;
  undefined4 *puVar2;
  long lVar3;
  long lVar4;
  undefined4 *puVar5;
  int_t *piVar6;
  int *piVar7;
  void *addr;
  long lVar8;
  long lVar9;
  long lVar10;
  char msg [256];
  char local_138 [264];
  
  n = A->ncol;
  lVar10 = (long)n;
  AC->Stype = SLU_NCP;
  AC->Dtype = A->Dtype;
  AC->Mtype = A->Mtype;
  AC->nrow = A->nrow;
  AC->ncol = n;
  puVar2 = (undefined4 *)A->Store;
  puVar5 = (undefined4 *)superlu_malloc(0x28);
  AC->Store = puVar5;
  if (puVar5 == (undefined4 *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ACstore",0x5d,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sp_preorder.c"
           );
    superlu_abort_and_exit(local_138);
  }
  *puVar5 = *puVar2;
  *(undefined8 *)(puVar5 + 2) = *(undefined8 *)(puVar2 + 2);
  *(undefined8 *)(puVar5 + 4) = *(undefined8 *)(puVar2 + 4);
  piVar6 = intMalloc(n);
  *(int_t **)(puVar5 + 6) = piVar6;
  if (piVar6 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ACstore->colbeg",0x62,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sp_preorder.c"
           );
    superlu_abort_and_exit(local_138);
  }
  piVar6 = intMalloc(n);
  *(int_t **)(puVar5 + 8) = piVar6;
  if (piVar6 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ACstore->colend",100,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sp_preorder.c"
           );
    superlu_abort_and_exit(local_138);
  }
  if (0 < n) {
    lVar9 = *(long *)(puVar2 + 6);
    lVar3 = *(long *)(puVar5 + 6);
    lVar4 = *(long *)(puVar5 + 8);
    lVar8 = 0;
    do {
      *(undefined4 *)(lVar3 + (long)perm_c[lVar8] * 4) = *(undefined4 *)(lVar9 + lVar8 * 4);
      lVar1 = lVar8 * 4;
      piVar7 = perm_c + lVar8;
      lVar8 = lVar8 + 1;
      *(undefined4 *)(lVar4 + (long)*piVar7 * 4) = *(undefined4 *)(lVar9 + 4 + lVar1);
    } while (lVar10 != lVar8);
  }
  if (options->Fact == DOFACT) {
    sp_coletree(*(int_t **)(puVar5 + 6),*(int_t **)(puVar5 + 8),*(int_t **)(puVar5 + 4),A->nrow,
                A->ncol,etree);
    if (options->SymmetricMode == NO) {
      piVar7 = TreePostorder(n,etree);
      addr = superlu_malloc(lVar10 * 4 + 4);
      if (addr == (void *)0x0) {
        sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for iwork[]",0xaf,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sp_preorder.c"
               );
        superlu_abort_and_exit(local_138);
      }
      if (0 < n) {
        lVar8 = 0;
        do {
          *(int *)((long)addr + (long)piVar7[lVar8] * 4) = piVar7[etree[lVar8]];
          lVar8 = lVar8 + 1;
        } while (lVar10 != lVar8);
      }
      if (0 < n) {
        lVar8 = 0;
        do {
          etree[lVar8] = *(int *)((long)addr + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar10 != lVar8);
      }
      if (0 < n) {
        lVar8 = *(long *)(puVar5 + 6);
        lVar9 = 0;
        do {
          *(undefined4 *)((long)addr + (long)piVar7[lVar9] * 4) = *(undefined4 *)(lVar8 + lVar9 * 4)
          ;
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
      if (0 < n) {
        lVar8 = *(long *)(puVar5 + 6);
        lVar9 = 0;
        do {
          *(undefined4 *)(lVar8 + lVar9 * 4) = *(undefined4 *)((long)addr + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
      if (0 < n) {
        lVar8 = *(long *)(puVar5 + 8);
        lVar9 = 0;
        do {
          *(undefined4 *)((long)addr + (long)piVar7[lVar9] * 4) = *(undefined4 *)(lVar8 + lVar9 * 4)
          ;
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
      if (0 < n) {
        lVar8 = *(long *)(puVar5 + 8);
        lVar9 = 0;
        do {
          *(undefined4 *)(lVar8 + lVar9 * 4) = *(undefined4 *)((long)addr + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
      if (0 < n) {
        lVar8 = 0;
        do {
          *(int *)((long)addr + lVar8 * 4) = piVar7[perm_c[lVar8]];
          lVar8 = lVar8 + 1;
        } while (lVar10 != lVar8);
      }
      if (0 < n) {
        lVar8 = 0;
        do {
          perm_c[lVar8] = *(int *)((long)addr + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar10 != lVar8);
      }
      superlu_free(piVar7);
      superlu_free(addr);
    }
  }
  return;
}

Assistant:

void sp_preorder(const superlu_options_t *options,  SuperMatrix *A, int *perm_c,
                 int *etree, SuperMatrix *AC)
{
    NCformat  *Astore;
    NCPformat *ACstore;
    int       *iwork, *post;
    register  int n, i;
    extern void check_perm(const char *what, int n, const int *perm);
	
    n = A->ncol;
    
    /* Apply column permutation perm_c to A's column pointers so to
       obtain NCP format in AC = A*Pc.  */
    AC->Stype       = SLU_NCP;
    AC->Dtype       = A->Dtype;
    AC->Mtype       = A->Mtype;
    AC->nrow        = A->nrow;
    AC->ncol        = A->ncol;
    Astore          = A->Store;
    ACstore = AC->Store = (void *) SUPERLU_MALLOC( sizeof(NCPformat) );
    if ( !ACstore ) ABORT("SUPERLU_MALLOC fails for ACstore");
    ACstore->nnz    = Astore->nnz;
    ACstore->nzval  = Astore->nzval;
    ACstore->rowind = Astore->rowind;
    ACstore->colbeg = intMalloc(n);
    if ( !(ACstore->colbeg) ) ABORT("SUPERLU_MALLOC fails for ACstore->colbeg");
    ACstore->colend = intMalloc(n);
    if ( !(ACstore->colend) ) ABORT("SUPERLU_MALLOC fails for ACstore->colend");

#if ( DEBUGlevel>=1 )
    check_perm("Initial perm_c", n, perm_c);
#endif      
#if ( DEBUGlevel>=2 )
    print_int_vec("pre_order:", n, perm_c);
#endif      

    for (i = 0; i < n; i++) {
	ACstore->colbeg[perm_c[i]] = Astore->colptr[i]; 
	ACstore->colend[perm_c[i]] = Astore->colptr[i+1];
    }
	
    if ( options->Fact == DOFACT ) {
#undef ETREE_ATplusA
#ifdef ETREE_ATplusA
        /*--------------------------------------------
	  COMPUTE THE ETREE OF Pc*(A'+A)*Pc'.
	  --------------------------------------------*/
        int *b_colptr, *b_rowind, bnz, j;
	int *c_colbeg, *c_colend;

        /*printf("Use etree(A'+A)\n");*/

	/* Form B = A + A'. */
	at_plus_a(n, Astore->nnz, Astore->colptr, Astore->rowind,
		  &bnz, &b_colptr, &b_rowind);

	/* Form C = Pc*B*Pc'. */
	c_colbeg = (int*) SUPERLU_MALLOC(2*n*sizeof(int));
	c_colend = c_colbeg + n;
	if (!c_colbeg ) ABORT("SUPERLU_MALLOC fails for c_colbeg/c_colend");
	for (i = 0; i < n; i++) {
	    c_colbeg[perm_c[i]] = b_colptr[i]; 
  	    c_colend[perm_c[i]] = b_colptr[i+1];
	}
	for (j = 0; j < n; ++j) {
	    for (i = c_colbeg[j]; i < c_colend[j]; ++i) {
	        b_rowind[i] = perm_c[b_rowind[i]];
	    }
	}

	/* Compute etree of C. */
	sp_symetree(c_colbeg, c_colend, b_rowind, n, etree);

	SUPERLU_FREE(b_colptr);
	if ( bnz ) SUPERLU_FREE(b_rowind);
	SUPERLU_FREE(c_colbeg);
	
#else
        /*--------------------------------------------
	  COMPUTE THE COLUMN ELIMINATION TREE.
	  --------------------------------------------*/
	sp_coletree(ACstore->colbeg, ACstore->colend, ACstore->rowind,
		    A->nrow, A->ncol, etree);
#endif
#if ( DEBUGlevel>=2 )
	print_int_vec("etree:", n, etree);
#endif	
	
	/* In symmetric mode, do not do postorder here. */
	if ( options->SymmetricMode == NO ) {
	    /* Post order etree */
	    post = (int *) TreePostorder(n, etree);
	    /* for (i = 0; i < n+1; ++i) inv_post[post[i]] = i;
	       iwork = post; */

#if ( DEBUGlevel>=1 )
	    check_perm("post", n, post);	
#endif	
#if ( DEBUGlevel>=2 )
	    print_int_vec("post:", n+1, post);
#endif	
	    iwork = (int*) SUPERLU_MALLOC((n+1)*sizeof(int)); 
	    if ( !iwork ) ABORT("SUPERLU_MALLOC fails for iwork[]");

	    /* Renumber etree in postorder */
	    for (i = 0; i < n; ++i) iwork[post[i]] = post[etree[i]];
	    for (i = 0; i < n; ++i) etree[i] = iwork[i];

#if ( DEBUGlevel>=2 )
	    print_int_vec("postorder etree:", n, etree);
#endif
	
	    /* Postmultiply A*Pc by post[] */
	    for (i = 0; i < n; ++i) iwork[post[i]] = ACstore->colbeg[i];
	    for (i = 0; i < n; ++i) ACstore->colbeg[i] = iwork[i];
	    for (i = 0; i < n; ++i) iwork[post[i]] = ACstore->colend[i];
	    for (i = 0; i < n; ++i) ACstore->colend[i] = iwork[i];

	    for (i = 0; i < n; ++i)
	        iwork[i] = post[perm_c[i]];  /* product of perm_c and post */
	    for (i = 0; i < n; ++i) perm_c[i] = iwork[i];

#if ( DEBUGlevel>=1 )
	    check_perm("final perm_c", n, perm_c);	
#endif
#if ( DEBUGlevel>=2 )
	    print_int_vec("Pc*post:", n, perm_c);
#endif
	    SUPERLU_FREE (post);
	    SUPERLU_FREE (iwork);
	} /* end postordering */

    } /* if options->Fact == DOFACT ... */

}